

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPassBase.hpp
# Opt level: O0

void __thiscall
Diligent::RenderPassBase<Diligent::EngineVkImplTraits>::Destruct
          (RenderPassBase<Diligent::EngineVkImplTraits> *this)

{
  Char *Message;
  undefined1 local_30 [8];
  string msg;
  RenderPassBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._8_8_ = this;
  if ((this->m_IsDestructed & 1U) != 0) {
    FormatString<char[40]>
              ((string *)local_30,(char (*) [40])"This object has already been destructed");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"Destruct",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderPassBase.hpp"
               ,0x78);
    std::__cxx11::string::~string((string *)local_30);
  }
  std::unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::reset
            (&this->m_pRawMemory,(pointer)0x0);
  this->m_AttachmentStates = (RESOURCE_STATE *)0x0;
  this->m_AttachmentFirstLastUse = (pair<unsigned_int,_unsigned_int> *)0x0;
  this->m_IsDestructed = true;
  return;
}

Assistant:

void Destruct()
    {
        VERIFY(!m_IsDestructed, "This object has already been destructed");

        m_pRawMemory.reset();

        m_AttachmentStates       = nullptr;
        m_AttachmentFirstLastUse = nullptr;

#if DILIGENT_DEBUG
        m_IsDestructed = true;
#endif
    }